

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

int prvTidySaveConfigSink(TidyDocImpl *doc,TidyOutputSink *sink)

{
  int iVar1;
  StreamOut *out;
  
  out = prvTidyUserOutput(doc,sink,*(int *)((doc->config).value + 0x3c),
                          *(uint *)((doc->config).value + 0x39));
  iVar1 = SaveConfigToStream(doc,out);
  (*doc->allocator->vtbl->free)(doc->allocator,out);
  return iVar1;
}

Assistant:

int  TY_(SaveConfigSink)( TidyDocImpl* doc, TidyOutputSink* sink )
{
    uint outenc = cfg( doc, TidyOutCharEncoding );
    uint nl = cfg( doc, TidyNewline );
    StreamOut* out = TY_(UserOutput)( doc, sink, outenc, nl );
    int status = SaveConfigToStream( doc, out );
    TidyDocFree( doc, out );
    return status;
}